

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checker.cc
# Opt level: O0

bool __thiscall xLearn::Checker::check_prediction_param(Checker *this,HyperParam *hyper_param)

{
  bool bVar1;
  undefined8 uVar2;
  ulong uVar3;
  long in_RSI;
  bool bo;
  string *in_stack_ffffffffffffff10;
  char *in_stack_ffffffffffffff30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff38;
  HyperParam *in_stack_ffffffffffffff48;
  Checker *in_stack_ffffffffffffff50;
  string local_90;
  string local_70 [8];
  char *in_stack_ffffffffffffff98;
  string local_40 [39];
  bool local_19;
  long local_18;
  
  local_19 = true;
  local_18 = in_RSI;
  if ((*(byte *)(in_RSI + 0x1ec) & 1) == 0) {
    bVar1 = *(long *)(in_RSI + 0x130) == 0;
    if (bVar1) {
      StringPrintf_abi_cxx11_((char *)local_70,"Test dataset is None, please check!");
      Color::print_error(in_stack_ffffffffffffff10);
      std::__cxx11::string::~string(local_70);
    }
    local_19 = !bVar1;
  }
  else {
    std::__cxx11::string::c_str();
    bVar1 = FileExist(in_stack_ffffffffffffff98);
    if (!bVar1) {
      uVar2 = std::__cxx11::string::c_str();
      StringPrintf_abi_cxx11_((char *)local_40,"Test set file: %s does not exist.",uVar2);
      Color::print_error(in_stack_ffffffffffffff10);
      std::__cxx11::string::~string(local_40);
      local_19 = false;
    }
  }
  std::__cxx11::string::c_str();
  bVar1 = FileExist(in_stack_ffffffffffffff98);
  if (!bVar1) {
    uVar2 = std::__cxx11::string::c_str();
    in_stack_ffffffffffffff10 = &local_90;
    StringPrintf_abi_cxx11_
              ((char *)in_stack_ffffffffffffff10,"Model file: %s does not exist.",uVar2);
    Color::print_error(in_stack_ffffffffffffff10);
    std::__cxx11::string::~string((string *)&local_90);
    local_19 = false;
  }
  if (*(int *)(local_18 + 0x68) < 0) {
    StringPrintf_abi_cxx11_
              (&stack0xffffffffffffff50,"The thread number must be greater than zero: %d.",
               (ulong)*(uint *)(local_18 + 0x68));
    Color::print_error(in_stack_ffffffffffffff10);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff50);
    local_19 = false;
  }
  if ((local_19 & 1U) == 0) {
    bVar1 = false;
  }
  else {
    check_conflict_predict(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    if (((*(byte *)(local_18 + 0x1ed) & 1) != 0) &&
       (uVar3 = std::__cxx11::string::empty(), (uVar3 & 1) != 0)) {
      std::operator+(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
      std::__cxx11::string::operator=
                ((string *)(local_18 + 0x1a0),(string *)&stack0xffffffffffffff30);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff30);
    }
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool Checker::check_prediction_param(HyperParam& hyper_param) {
 bool bo = true;
 /*********************************************************
  *  Check the path of test set file                      *
  *********************************************************/
 if (hyper_param.from_file) {
  if (!FileExist(hyper_param.test_set_file.c_str())) {
      Color::print_error(
        StringPrintf("Test set file: %s does not exist.",
            hyper_param.test_set_file.c_str())
      );
      bo =  false;
  }
 } else {
   if (hyper_param.test_dataset == nullptr) {
      Color::print_error(
        StringPrintf("Test dataset is None, please check!")
      );
      bo =  false;
   }
 }
 /*********************************************************
  *  Check the path of model file                         *
  *********************************************************/
 if (!FileExist(hyper_param.model_file.c_str())) {
    Color::print_error(
      StringPrintf("Model file: %s does not exist.",
           hyper_param.model_file.c_str())
    );
    bo = false;
 }
 /*********************************************************
  *  Check invalid value                                  *
  *********************************************************/
 if (hyper_param.thread_number < 0) {
    Color::print_error(
      StringPrintf("The thread number must be greater than zero: %d.",
        hyper_param.thread_number)
    );
    bo = false;
  }
 if (!bo) return false;
 /*********************************************************
  *  Check warning and fix conflict                       *
  *********************************************************/
 check_conflict_predict(hyper_param);
 /*********************************************************
  *  Set default value                                    *
  *********************************************************/
 if (hyper_param.res_out) {
  if (hyper_param.output_file.empty()) {
    hyper_param.output_file = hyper_param.test_set_file + ".out";
  }
 }

 return true;
}